

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

MempoolAcceptResult *
AcceptToMemoryPool(MempoolAcceptResult *__return_storage_ptr__,Chainstate *active_chainstate,
                  CTransactionRef *tx,int64_t accept_time,bool bypass_limits,bool test_accept)

{
  long lVar1;
  pointer pCVar2;
  CCoinsViewCache *this;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range2;
  COutPoint *hashTx;
  COutPoint *hash;
  long in_FS_OFFSET;
  vector<COutPoint,_std::allocator<COutPoint>_> coins_to_uncache;
  ATMPArgs local_360;
  BlockValidationState state_dummy;
  
  local_360.m_coins_to_uncache = &coins_to_uncache;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (active_chainstate->m_mempool == (CTxMemPool *)0x0) {
    __assert_fail("active_chainstate.GetMempool() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                  ,0x747,
                  "MempoolAcceptResult AcceptToMemoryPool(Chainstate &, const CTransactionRef &, int64_t, bool, bool)"
                 );
  }
  local_360.m_chainparams = (active_chainstate->m_chainman->m_options).chainparams;
  coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360.m_allow_replacement = true;
  local_360.m_allow_sibling_eviction = true;
  local_360.m_package_submission = false;
  local_360.m_package_feerates = false;
  local_360.m_client_maxfeerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = false;
  local_360.m_allow_carveouts = true;
  local_360.m_accept_time = accept_time;
  local_360.m_bypass_limits = bypass_limits;
  local_360.m_test_accept = test_accept;
  anon_unknown.dwarf_2d29a37::MemPoolAccept::MemPoolAccept
            ((MemPoolAccept *)&state_dummy,active_chainstate->m_mempool,active_chainstate);
  anon_unknown.dwarf_2d29a37::MemPoolAccept::AcceptSingleTransaction
            (__return_storage_ptr__,(MemPoolAccept *)&state_dummy,tx,&local_360);
  anon_unknown.dwarf_2d29a37::MemPoolAccept::~MemPoolAccept((MemPoolAccept *)&state_dummy);
  pCVar2 = coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  hash = coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
         super__Vector_impl_data._M_start;
  if (__return_storage_ptr__->m_result_type != VALID) {
    for (; hash != pCVar2; hash = hash + 1) {
      this = Chainstate::CoinsTip(active_chainstate);
      CCoinsViewCache::Uncache(this,hash);
    }
  }
  state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state_dummy.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state_dummy.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state_dummy.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
       '\0';
  state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state_dummy.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  Chainstate::FlushStateToDisk(active_chainstate,&state_dummy,PERIODIC,0);
  ValidationState<BlockValidationResult>::~ValidationState
            (&state_dummy.super_ValidationState<BlockValidationResult>);
  std::_Vector_base<COutPoint,_std::allocator<COutPoint>_>::~_Vector_base
            (&coins_to_uncache.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

MempoolAcceptResult AcceptToMemoryPool(Chainstate& active_chainstate, const CTransactionRef& tx,
                                       int64_t accept_time, bool bypass_limits, bool test_accept)
{
    AssertLockHeld(::cs_main);
    const CChainParams& chainparams{active_chainstate.m_chainman.GetParams()};
    assert(active_chainstate.GetMempool() != nullptr);
    CTxMemPool& pool{*active_chainstate.GetMempool()};

    std::vector<COutPoint> coins_to_uncache;
    auto args = MemPoolAccept::ATMPArgs::SingleAccept(chainparams, accept_time, bypass_limits, coins_to_uncache, test_accept);
    MempoolAcceptResult result = MemPoolAccept(pool, active_chainstate).AcceptSingleTransaction(tx, args);
    if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
        // Remove coins that were not present in the coins cache before calling
        // AcceptSingleTransaction(); this is to prevent memory DoS in case we receive a large
        // number of invalid transactions that attempt to overrun the in-memory coins cache
        // (`CCoinsViewCache::cacheCoins`).

        for (const COutPoint& hashTx : coins_to_uncache)
            active_chainstate.CoinsTip().Uncache(hashTx);
        TRACE2(mempool, rejected,
                tx->GetHash().data(),
                result.m_state.GetRejectReason().c_str()
        );
    }
    // After we've (potentially) uncached entries, ensure our coins cache is still within its size limits
    BlockValidationState state_dummy;
    active_chainstate.FlushStateToDisk(state_dummy, FlushStateMode::PERIODIC);
    return result;
}